

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverCrossSymbol::addBody(CoverCrossSymbol *this,CoverCrossSyntax *syntax,Scope *scope)

{
  string_view name;
  bool bVar1;
  reference ppCVar2;
  TypeAliasType *pTVar3;
  QueueType *newType;
  reference ppMVar4;
  Scope *in_RDX;
  long in_RSI;
  OptionBuilder *in_RDI;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> sVar5;
  MemberSyntax *member;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::MemberSyntax> *__range2_1;
  OptionBuilder optionBuilder;
  TypeAliasType *queueType_t;
  QueueType *queueType;
  TypeAliasType *valType_t;
  CoverpointSymbol *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *__range2;
  StructBuilder valType;
  CoverCrossBodySymbol *body;
  Compilation *comp;
  SyntaxNode *in_stack_00000378;
  Scope *in_stack_00000380;
  Symbol *in_stack_fffffffffffffd18;
  Type *in_stack_fffffffffffffd20;
  Compilation *in_stack_fffffffffffffd28;
  OptionBuilder *in_stack_fffffffffffffd30;
  Type *in_stack_fffffffffffffd38;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_288;
  long local_280;
  Scope *in_stack_fffffffffffffd88;
  DeclaredType *in_stack_fffffffffffffd90;
  LookupLocation in_stack_fffffffffffffd98;
  CoverageOptionSyntax *in_stack_fffffffffffffdf0;
  OptionBuilder *in_stack_fffffffffffffdf8;
  bitmask<slang::ast::VariableFlags> local_8a;
  size_t local_88;
  char *local_80;
  CoverpointSymbol *local_78;
  CoverpointSymbol **local_70;
  __normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
  local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  Type *local_40;
  CoverCrossBodySymbol *local_28;
  Compilation *local_20;
  long local_10;
  
  local_10 = in_RSI;
  local_20 = Scope::getCompilation(in_RDX);
  local_28 = BumpAllocator::
             emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
                       ((BumpAllocator *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        (SourceLocation *)in_stack_fffffffffffffd20);
  Scope::addMember((Scope *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_58 = LookupLocation::min;
  local_50 = DAT_00d8a550;
  StructBuilder::StructBuilder
            ((StructBuilder *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             in_stack_fffffffffffffd98);
  local_60 = (in_RDI->options).stackBase + 0x40;
  local_68._M_current =
       (CoverpointSymbol **)
       std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffd18);
  local_70 = (CoverpointSymbol **)
             std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffffd28);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd20,
                       (__normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_68);
    local_78 = *ppCVar2;
    local_88 = (local_78->super_Symbol).name._M_len;
    local_80 = (local_78->super_Symbol).name._M_str;
    in_stack_fffffffffffffd38 = DeclaredType::getType(in_stack_fffffffffffffd90);
    bitmask<slang::ast::VariableFlags>::bitmask(&local_8a,None);
    name._M_str = (char *)in_RDI;
    name._M_len = (size_t)in_stack_fffffffffffffd38;
    StructBuilder::addField
              ((StructBuilder *)in_stack_fffffffffffffd28,name,in_stack_fffffffffffffd20,
               (bitmask<slang::ast::VariableFlags>)
               (underlying_type)((ulong)in_stack_fffffffffffffd30 >> 0x30));
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CoverpointSymbol_*const_*,_std::span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_68);
  }
  pTVar3 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[13],slang::SourceLocation&>
                     ((BumpAllocator *)in_RDI,(char (*) [13])in_stack_fffffffffffffd38,
                      (SourceLocation *)in_stack_fffffffffffffd30);
  DeclaredType::setType(&pTVar3->targetType,local_40);
  Scope::addMember((Scope *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  newType = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
                      ((BumpAllocator *)in_stack_fffffffffffffd30,
                       (TypeAliasType *)in_stack_fffffffffffffd28,(uint *)in_stack_fffffffffffffd20)
  ;
  pTVar3 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[15],slang::SourceLocation&>
                     ((BumpAllocator *)in_RDI,(char (*) [15])in_stack_fffffffffffffd38,
                      (SourceLocation *)in_stack_fffffffffffffd30);
  DeclaredType::setType(&pTVar3->targetType,&newType->super_Type);
  Scope::addMember((Scope *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_28->crossQueueType = &pTVar3->super_Type;
  anon_unknown.dwarf_121237a::OptionBuilder::OptionBuilder
            (in_RDI,(Scope *)in_stack_fffffffffffffd38);
  local_280 = local_10 + 0xb8;
  local_288._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffd18);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffd28);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd20,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_288);
    if (((*ppMVar4)->super_SyntaxNode).kind == CoverageOption) {
      in_stack_fffffffffffffd30 =
           (OptionBuilder *)
           slang::syntax::SyntaxNode::as<slang::syntax::CoverageOptionSyntax>
                     (&(*ppMVar4)->super_SyntaxNode);
      anon_unknown.dwarf_121237a::OptionBuilder::add
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    }
    else {
      Scope::addMembers(in_stack_00000380,in_stack_00000378);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_288);
  }
  sVar5 = anon_unknown.dwarf_121237a::OptionBuilder::get(in_stack_fffffffffffffd30);
  *(span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
   ((in_RDI->instNames).super_Storage.buffer + 8) = sVar5;
  anon_unknown.dwarf_121237a::OptionBuilder::~OptionBuilder
            ((OptionBuilder *)sVar5._M_extent._M_extent_value._M_extent_value);
  return;
}

Assistant:

void CoverCrossSymbol::addBody(const syntax::CoverCrossSyntax& syntax, const Scope& scope) {
    auto& comp = scope.getCompilation();
    auto body = comp.emplace<CoverCrossBodySymbol>(comp, location);
    addMember(*body);

    StructBuilder valType(*body, LookupLocation::min);
    for (auto item : targets)
        valType.addField(item->name, item->declaredType.getType());

    auto valType_t = comp.emplace<TypeAliasType>("CrossValType", location);
    valType_t->targetType.setType(valType.type);
    body->addMember(*valType_t);

    auto queueType = comp.emplace<QueueType>(*valType_t, 0u);
    auto queueType_t = comp.emplace<TypeAliasType>("CrossQueueType", location);
    queueType_t->targetType.setType(*queueType);
    body->addMember(*queueType_t);
    body->crossQueueType = queueType_t;

    OptionBuilder optionBuilder(*this);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            optionBuilder.add(member->as<CoverageOptionSyntax>());
        else
            body->addMembers(*member);
    }

    options = optionBuilder.get();
}